

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkPipelineDepthStencilStateCreateInfo *
Diligent::DepthStencilStateDesc_To_VkDepthStencilStateCI
          (VkPipelineDepthStencilStateCreateInfo *__return_storage_ptr__,
          DepthStencilStateDesc *DepthStencilDesc)

{
  VkCompareOp VVar1;
  VkPipelineDepthStencilStateCreateInfo *DSStateCI;
  VkStencilOpState local_48;
  VkStencilOpState local_2c;
  DepthStencilStateDesc *local_10;
  DepthStencilStateDesc *DepthStencilDesc_local;
  
  local_10 = DepthStencilDesc;
  memset(__return_storage_ptr__,0,0x68);
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->depthTestEnable = (uint)((local_10->DepthEnable & 1U) != 0);
  __return_storage_ptr__->depthWriteEnable = (uint)((local_10->DepthWriteEnable & 1U) != 0);
  VVar1 = ComparisonFuncToVkCompareOp(local_10->DepthFunc);
  __return_storage_ptr__->depthCompareOp = VVar1;
  __return_storage_ptr__->depthBoundsTestEnable = 0;
  __return_storage_ptr__->stencilTestEnable = (uint)((local_10->StencilEnable & 1U) != 0);
  StencilOpDescToVkStencilOpState
            (&local_2c,&local_10->FrontFace,local_10->StencilReadMask,local_10->StencilWriteMask);
  (__return_storage_ptr__->front).failOp = local_2c.failOp;
  (__return_storage_ptr__->front).passOp = local_2c.passOp;
  (__return_storage_ptr__->front).depthFailOp = local_2c.depthFailOp;
  (__return_storage_ptr__->front).compareOp = local_2c.compareOp;
  (__return_storage_ptr__->front).compareMask = local_2c.compareMask;
  (__return_storage_ptr__->front).writeMask = local_2c.writeMask;
  (__return_storage_ptr__->front).reference = local_2c.reference;
  StencilOpDescToVkStencilOpState
            (&local_48,&local_10->BackFace,local_10->StencilReadMask,local_10->StencilWriteMask);
  (__return_storage_ptr__->back).failOp = local_48.failOp;
  (__return_storage_ptr__->back).passOp = local_48.passOp;
  (__return_storage_ptr__->back).depthFailOp = local_48.depthFailOp;
  (__return_storage_ptr__->back).compareOp = local_48.compareOp;
  (__return_storage_ptr__->back).compareMask = local_48.compareMask;
  (__return_storage_ptr__->back).writeMask = local_48.writeMask;
  (__return_storage_ptr__->back).reference = local_48.reference;
  __return_storage_ptr__->minDepthBounds = 0.0;
  __return_storage_ptr__->maxDepthBounds = 1.0;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineDepthStencilStateCreateInfo DepthStencilStateDesc_To_VkDepthStencilStateCI(const DepthStencilStateDesc& DepthStencilDesc)
{
    // Depth-stencil state
    VkPipelineDepthStencilStateCreateInfo DSStateCI = {};

    DSStateCI.sType                 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
    DSStateCI.pNext                 = nullptr;
    DSStateCI.flags                 = 0; // reserved for future use
    DSStateCI.depthTestEnable       = DepthStencilDesc.DepthEnable ? VK_TRUE : VK_FALSE;
    DSStateCI.depthWriteEnable      = DepthStencilDesc.DepthWriteEnable ? VK_TRUE : VK_FALSE;
    DSStateCI.depthCompareOp        = ComparisonFuncToVkCompareOp(DepthStencilDesc.DepthFunc); // 25.10
    DSStateCI.depthBoundsTestEnable = VK_FALSE;                                                // 25.8
    DSStateCI.stencilTestEnable     = DepthStencilDesc.StencilEnable ? VK_TRUE : VK_FALSE;     // 25.9
    DSStateCI.front                 = StencilOpDescToVkStencilOpState(DepthStencilDesc.FrontFace, DepthStencilDesc.StencilReadMask, DepthStencilDesc.StencilWriteMask);
    DSStateCI.back                  = StencilOpDescToVkStencilOpState(DepthStencilDesc.BackFace, DepthStencilDesc.StencilReadMask, DepthStencilDesc.StencilWriteMask);
    // Depth Bounds Test
    DSStateCI.minDepthBounds = 0; // must be between 0.0 and 1.0, inclusive
    DSStateCI.maxDepthBounds = 1; // must be between 0.0 and 1.0, inclusive

    return DSStateCI;
}